

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

exr_result_t scratch_seq_skip(_internal_exr_seq_scratch *scr,uint64_t sz)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t notdone;
  uint64_t uVar5;
  int64_t nread;
  ulong local_38;
  
  if (sz == 0) {
    iVar2 = 0;
  }
  else {
    local_38 = scr->navail;
    iVar1 = -1;
    uVar5 = 0;
    uVar4 = sz;
    do {
      if ((long)local_38 < 1) {
        local_38 = 0;
        iVar1 = (*scr->ctxt->do_read)
                          (scr->ctxt,scr->scratch,0x1000,&scr->fileoff,(int64_t *)&local_38,
                           EXR_ALLOW_SHORT_READ);
        if ((long)local_38 < 1) {
          if (local_38 == 0) {
            iVar1 = (*scr->ctxt->report_error)(scr->ctxt,10,"End of file attempting to read header")
            ;
          }
          break;
        }
        scr->navail = local_38;
        scr->curpos = 0;
      }
      else {
        uVar3 = local_38;
        if (uVar4 < local_38) {
          uVar3 = uVar4;
        }
        scr->curpos = scr->curpos + uVar3;
        local_38 = local_38 - uVar3;
        scr->navail = local_38;
        uVar4 = uVar4 - uVar3;
        uVar5 = uVar5 + uVar3;
      }
    } while (uVar4 != 0);
    iVar2 = 10;
    if (uVar5 == sz) {
      iVar2 = 0;
    }
    if (iVar1 != -1) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

static exr_result_t
scratch_seq_skip (struct _internal_exr_seq_scratch* scr, uint64_t sz)
{
    uint64_t     nCopied = 0;
    uint64_t     notdone = sz;
    exr_result_t rv      = -1;

    while (notdone > 0)
    {
        if (scr->navail > 0)
        {
            uint64_t nLeft = (uint64_t) scr->navail;
            uint64_t nCopy = notdone;
            if (nCopy > nLeft) nCopy = nLeft;
            scr->curpos += nCopy;
            scr->navail -= (int64_t) nCopy;
            notdone -= nCopy;
            nCopied += nCopy;
        }
        else
        {
            int64_t nread = 0;
            rv            = scr->ctxt->do_read (
                scr->ctxt,
                scr->scratch,
                SCRATCH_BUFFER_SIZE,
                &(scr->fileoff),
                &nread,
                EXR_ALLOW_SHORT_READ);
            if (nread > 0)
            {
                scr->navail = nread;
                scr->curpos = 0;
            }
            else
            {
                if (nread == 0)
                    rv = scr->ctxt->report_error (
                        scr->ctxt,
                        EXR_ERR_READ_IO,
                        "End of file attempting to read header");
                break;
            }
        }
    }
    if (rv == -1)
    {
        if (nCopied == sz)
            rv = EXR_ERR_SUCCESS;
        else
            rv = EXR_ERR_READ_IO;
    }
    return rv;
}